

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getattributes(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  HSQUIRRELVM in_RSI;
  SQObjectPtr *unaff_retaddr;
  SQClass *in_stack_00000008;
  SQObjectPtr attrs;
  SQObjectPtr *key;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  SQObjectPtr *in_stack_ffffffffffffffc0;
  SQObjectValue in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  SQObjectPtr *in_stack_fffffffffffffff8;
  SQRESULT SVar3;
  
  bVar1 = sq_aux_gettypedarg(in_RSI,0,(SQObjectType)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                             (SQObjectPtr **)in_stack_ffffffffffffffd0.pTable);
  if (bVar1) {
    pSVar2 = stack_get((HSQUIRRELVM)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       (SQInteger)in_stack_ffffffffffffffa8);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc8);
    if ((pSVar2->super_SQObject)._type == OT_NULL) {
      SQObjectPtr::operator=
                (in_stack_ffffffffffffffc0,
                 (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      SQVM::Pop((SQVM *)0x10c5a5);
      SQVM::Push((SQVM *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
      SVar3 = 0;
    }
    else {
      in_stack_ffffffffffffffb7 =
           SQClass::GetAttributes(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
      if ((bool)in_stack_ffffffffffffffb7) {
        SQVM::Pop((SQVM *)0x10c61d);
        SQVM::Push((SQVM *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8);
        SVar3 = 0;
      }
      else {
        SVar3 = sq_throwerror((HSQUIRRELVM)
                              CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                              (SQChar *)in_stack_ffffffffffffffa8);
      }
    }
    SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  }
  else {
    SVar3 = -1;
  }
  return SVar3;
}

Assistant:

SQRESULT sq_getattributes(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    SQObjectPtr &key = stack_get(v,-1);
    SQObjectPtr attrs;
    if(sq_type(key) == OT_NULL) {
        attrs = _class(*o)->_attributes;
        v->Pop();
        v->Push(attrs);
        return SQ_OK;
    }
    else if(_class(*o)->GetAttributes(key,attrs)) {
        v->Pop();
        v->Push(attrs);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong index"));
}